

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall cimg_library::CImgDisplay::move(CImgDisplay *this,int posx,int posy)

{
  Display *pDVar1;
  X11_static *pXVar2;
  CImgDisplay *pCVar3;
  
  if ((this->_width != 0) && (this->_height != 0)) {
    show(this);
    if ((this->_window_x != posx) || (this->_window_y != posy)) {
      pXVar2 = cimg::X11_attr();
      pDVar1 = pXVar2->display;
      cimg::mutex(0xf,1);
      XMoveWindow(pDVar1,this->_window,posx,posy);
      this->_window_x = posx;
      this->_window_y = posy;
      cimg::mutex(0xf,0);
    }
    this->_is_moved = false;
    pCVar3 = paint(this,true);
    return pCVar3;
  }
  return this;
}

Assistant:

CImgDisplay& move(const int posx, const int posy) {
      if (is_empty()) return *this;
      show();
      if (_window_x!=posx || _window_y!=posy) {
        Display *const dpy = cimg::X11_attr().display;
        cimg_lock_display();
        XMoveWindow(dpy,_window,posx,posy);
        _window_x = posx;
        _window_y = posy;
        cimg_unlock_display();
      }
      _is_moved = false;
      return paint();
    }